

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void CTcSymLocal::s_gen_code_getlcl(int var_num,int is_param)

{
  int iVar1;
  int iVar2;
  char cVar3;
  CTcGenTarg *pCVar4;
  bool bVar5;
  undefined8 in_RCX;
  void *__buf;
  uchar opc;
  size_t __n;
  
  cVar3 = (char)var_num;
  if (var_num < 4 && is_param != 0) {
    opc = cVar3 + '|';
  }
  else {
    bVar5 = 5 < var_num || is_param != 0;
    __n = CONCAT71((int7)((ulong)in_RCX >> 8),bVar5);
    if (bVar5) {
      if (var_num < 0x100) {
        CTcGenTarg::write_op(G_cg,(is_param != 0) * '\x02' + 0x80);
        CTcDataStream::write(&G_cs->super_CTcDataStream,(int)cVar3,__buf,__n);
      }
      else {
        CTcGenTarg::write_op(G_cg,(is_param != 0) * '\x02' + 0x81);
        CTcDataStream::write2(&G_cs->super_CTcDataStream,var_num);
      }
      goto LAB_002428a9;
    }
    opc = cVar3 + 0xaa;
  }
  CTcGenTarg::write_op(G_cg,opc);
LAB_002428a9:
  pCVar4 = G_cg;
  iVar2 = G_cg->sp_depth_;
  iVar1 = iVar2 + 1;
  G_cg->sp_depth_ = iVar1;
  if (pCVar4->max_sp_depth_ <= iVar2) {
    pCVar4->max_sp_depth_ = iVar1;
  }
  return;
}

Assistant:

void CTcSymLocal::s_gen_code_getlcl(int var_num, int is_param)
{
    /* use the shortest form of the instruction that we can */
    if (is_param && var_num < 4)
    {
        /* arguments 0-3 have dedicated opcodes */
        G_cg->write_op(OPC_GETARGN0 + var_num);
    }
    else if (!is_param && var_num < 6)
    {
        /* locals 0-5 have dedicated opcodes */
        G_cg->write_op(OPC_GETLCLN0 + var_num);
    }
    else if (var_num <= 255)
    {
        /* 8-bit local number - use the one-byte form */
        G_cg->write_op(is_param ? OPC_GETARG1 : OPC_GETLCL1);
        G_cs->write((char)var_num);
    }
    else
    {
        /* local number won't fit in 8 bits - use the two-byte form */
        G_cg->write_op(is_param ? OPC_GETARG2 : OPC_GETLCL2);
        G_cs->write2(var_num);
    }

    /* note the push */
    G_cg->note_push();
}